

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O0

String * Rml::StringUtilities::EncodeRml(String *__return_storage_ptr__,String *string)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  String *__range1;
  String *string_local;
  String *result;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end1._M_current = (char *)::std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)::std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    switch(*pcVar2) {
    case '\"':
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&quot;");
      break;
    default:
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
      break;
    case '&':
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&amp;");
      break;
    case '<':
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&lt;");
      break;
    case '>':
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&gt;");
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

RMLUICORE_API String StringUtilities::EncodeRml(const String& string)
{
	String result;
	result.reserve(string.size());
	for (char c : string)
	{
		switch (c)
		{
		case '<': result += "&lt;"; break;
		case '>': result += "&gt;"; break;
		case '&': result += "&amp;"; break;
		case '"': result += "&quot;"; break;
		default: result += c; break;
		}
	}
	return result;
}